

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TPZCompElHCurl.cpp
# Opt level: O1

void __thiscall
TPZCompElHCurl<pzshape::TPZShapeLinear>::TPZCompElHCurl
          (TPZCompElHCurl<pzshape::TPZShapeLinear> *this)

{
  *(undefined ***)
   &(this->super_TPZIntelGen<pzshape::TPZShapeLinear>).super_TPZInterpolatedElement.
    super_TPZInterpolationSpace.super_TPZCompEl = &PTR__TPZSavable_019709a8;
  TPZIntelGen<pzshape::TPZShapeLinear>::TPZIntelGen
            (&this->super_TPZIntelGen<pzshape::TPZShapeLinear>,&PTR_PTR_0196e430);
  *(undefined ***)
   &(this->super_TPZIntelGen<pzshape::TPZShapeLinear>).super_TPZInterpolatedElement.
    super_TPZInterpolationSpace.super_TPZCompEl = &PTR__TPZCompElHCurl_0196e060;
  TPZVec<long>::TPZVec(&(this->fConnectIndexes).super_TPZVec<long>,0);
  (this->fConnectIndexes).super_TPZVec<long>._vptr_TPZVec =
       (_func_int **)&PTR__TPZManVector_018b4e60;
  (this->fConnectIndexes).super_TPZVec<long>.fStore = (this->fConnectIndexes).fExtAlloc;
  (this->fConnectIndexes).super_TPZVec<long>.fNElements = 1;
  (this->fConnectIndexes).super_TPZVec<long>.fNAlloc = 0;
  (this->fConnectIndexes).fExtAlloc[0] = -1;
  this->fhcurlfam = EHCurlStandard;
  (this->super_TPZIntelGen<pzshape::TPZShapeLinear>).super_TPZInterpolatedElement.
  super_TPZInterpolationSpace.fPreferredOrder = -1;
  return;
}

Assistant:

TPZCompElHCurl<TSHAPE>::TPZCompElHCurl() :
TPZRegisterClassId(&TPZCompElHCurl::ClassId),
TPZIntelGen<TSHAPE>()
{
	this->fPreferredOrder = -1;
	int i;
	for(i=0;i<TSHAPE::NSides-TSHAPE::NCornerNodes;i++) {
		this-> fConnectIndexes[i] = -1;
	}

}